

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O0

SubroutineSymbol * __thiscall slang::ast::ClassType::getConstructor(ClassType *this)

{
  string_view name;
  string_view name_00;
  bool bVar1;
  bitmask<slang::ast::MethodFlags> bVar2;
  Symbol *pSVar3;
  SyntaxNode *this_00;
  Scope *this_01;
  ClassDeclarationSyntax *pCVar4;
  Compilation *this_02;
  MethodBuilder *in_RDI;
  MethodBuilder builder;
  Compilation *comp;
  ExtendsClauseSyntax *extendsClause;
  Scope *scope;
  SyntaxNode *syntax;
  SubroutineSymbol *sub;
  Symbol *constructor;
  MethodBuilder *in_stack_fffffffffffffee8;
  bitmask<slang::ast::MethodFlags> *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff00;
  Compilation *pCVar5;
  Compilation *in_stack_ffffffffffffff18;
  char *pcVar6;
  char *in_stack_ffffffffffffff30;
  Symbol *in_stack_ffffffffffffff48;
  Symbol *in_stack_ffffffffffffff50;
  Scope *in_stack_ffffffffffffff58;
  SubroutineSymbol *local_a0;
  SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> *in_stack_ffffffffffffffc8;
  SubroutineSymbol *in_stack_ffffffffffffffd0;
  Scope *in_stack_ffffffffffffffd8;
  Scope *in_stack_ffffffffffffffe0;
  SubroutineKind kind;
  
  pcVar6 = (in_RDI->args).stackBase + 0x18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  name_00._M_str = (char *)in_stack_ffffffffffffff58;
  name_00._M_len = (size_t)in_stack_ffffffffffffff50;
  pSVar3 = Scope::find((Scope *)in_stack_ffffffffffffff48,name_00);
  if ((pSVar3 != (Symbol *)0x0) && (pSVar3->kind == Subroutine)) {
    in_stack_ffffffffffffffd0 = Symbol::as<slang::ast::SubroutineSymbol>((Symbol *)0x3f9ae0);
    in_stack_ffffffffffffff18 = (Compilation *)&in_stack_ffffffffffffffd0->flags;
    bitmask<slang::ast::MethodFlags>::bitmask
              ((bitmask<slang::ast::MethodFlags> *)&stack0xffffffffffffffce,Constructor);
    bVar1 = bitmask<slang::ast::MethodFlags>::has
                      (in_stack_fffffffffffffef0,
                       (bitmask<slang::ast::MethodFlags> *)in_stack_fffffffffffffee8);
    if (bVar1) {
      return in_stack_ffffffffffffffd0;
    }
  }
  this_00 = Symbol::getSyntax((Symbol *)in_RDI);
  this_01 = Symbol::getParentScope((Symbol *)in_RDI);
  if ((this_00 != (SyntaxNode *)0x0) && (this_01 != (Scope *)0x0)) {
    pCVar4 = slang::syntax::SyntaxNode::as<slang::syntax::ClassDeclarationSyntax>(this_00);
    if ((pCVar4->extendsClause != (ExtendsClauseSyntax *)0x0) &&
       (pCVar4->extendsClause->defaultedArg != (DefaultExtendsClauseArgSyntax *)0x0)) {
      this_02 = Scope::getCompilation(this_01);
      pCVar5 = this_02;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      kind = (SubroutineKind)((ulong)pCVar5 >> 0x20);
      Compilation::getVoidType(this_02);
      name._M_str = in_stack_ffffffffffffff30;
      name._M_len = (size_t)pcVar6;
      MethodBuilder::MethodBuilder
                (in_RDI,in_stack_ffffffffffffff18,name,(Type *)&stack0xffffffffffffff58,kind);
      bVar2 = ast::operator|((MethodFlags)((ulong)in_stack_fffffffffffffef0 >> 0x20),
                             (MethodFlags)((ulong)in_stack_fffffffffffffef0 >> 0x10));
      MethodBuilder::addFlags
                (in_stack_fffffffffffffee8,
                 (bitmask<slang::ast::MethodFlags>)
                 (underlying_type)((ulong)in_stack_fffffffffffffef0 >> 0x30));
      SubroutineSymbol::inheritDefaultedArgList
                (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                 (SyntaxNode *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      Scope::getLastMember((Scope *)((in_RDI->args).stackBase + 0x18));
      Scope::insertMember(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                          in_stack_ffffffffffffff48,SUB21(bVar2.m_bits >> 8,0),SUB21(bVar2.m_bits,0)
                         );
      MethodBuilder::~MethodBuilder(in_RDI);
      return local_a0;
    }
  }
  return (SubroutineSymbol *)0x0;
}

Assistant:

const SubroutineSymbol* ClassType::getConstructor() const {
    if (auto constructor = find("new");
        constructor && constructor->kind == SymbolKind::Subroutine) {
        auto& sub = constructor->as<SubroutineSymbol>();
        if (sub.flags.has(MethodFlags::Constructor))
            return &sub;
    }

    // If our extends clause specifies 'default' for the argument list
    // we will auto-generate an appropriate constructor if the user
    // has not provided one.
    auto syntax = getSyntax();
    auto scope = getParentScope();
    if (syntax && scope) {
        auto extendsClause = syntax->as<ClassDeclarationSyntax>().extendsClause;
        if (extendsClause && extendsClause->defaultedArg) {
            auto& comp = scope->getCompilation();
            MethodBuilder builder(comp, "new", comp.getVoidType(), SubroutineKind::Function);
            builder.addFlags(MethodFlags::Constructor | MethodFlags::DefaultedSuperArg);

            SubroutineSymbol::inheritDefaultedArgList(builder.symbol, *this,
                                                      *extendsClause->defaultedArg, builder.args);

            insertMember(&builder.symbol, getLastMember(), true, true);
            return &builder.symbol;
        }
    }

    return nullptr;
}